

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O0

void __thiscall capnp::_::ReadLimiter::unread(ReadLimiter *this,WordCount64 amount)

{
  ulong uVar1;
  unsigned_long uVar2;
  ulong uVar3;
  uint64_t newValue;
  uint64_t oldValue;
  WordCount64 amount_local;
  ReadLimiter *this_local;
  
  uVar1 = this->limit;
  uVar2 = unbound<unsigned_long>(amount);
  uVar3 = uVar1 + uVar2;
  if (uVar1 < uVar3) {
    this->limit = uVar3;
  }
  return;
}

Assistant:

void ReadLimiter::unread(WordCount64 amount) {
  // Be careful not to overflow here.  Since ReadLimiter has no thread-safety, it's possible that
  // the limit value was not updated correctly for one or more reads, and therefore unread() could
  // overflow it even if it is only unreading bytes that were actually read.
  uint64_t oldValue = limit;
  uint64_t newValue = oldValue + unbound(amount / WORDS);
  if (newValue > oldValue) {
    limit = newValue;
  }
}